

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O2

void Diligent::LinuxDebug::OutputDebugMessage
               (DEBUG_MESSAGE_SEVERITY Severity,Char *Message,char *Function,char *File,int Line,
               TextColor Color)

{
  char *pcVar1;
  ostream *poVar2;
  String msg;
  int in_stack_ffffffffffffffc8;
  String local_30;
  
  BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
            (&local_30,(BasicPlatformDebug *)(ulong)Severity,(DEBUG_MESSAGE_SEVERITY)Message,
             Function,File,(char *)(ulong)(uint)Line,in_stack_ffffffffffffffc8);
  pcVar1 = BasicPlatformDebug::TextColorToTextColorCode(Severity,Color);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  std::operator<<(poVar2,"\x1b[39m");
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void LinuxDebug::OutputDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                    const Char*            Message,
                                    const char*            Function,
                                    const char*            File,
                                    int                    Line,
                                    TextColor              Color)
{
    auto msg = FormatDebugMessage(Severity, Message, Function, File, Line);

    const auto* ColorCode = TextColorToTextColorCode(Severity, Color);
    std::cout << ColorCode << msg << TextColorCode::Default;
}